

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

void __thiscall QMYSQLDriver::QMYSQLDriver(QMYSQLDriver *this,QObject *parent)

{
  QMYSQLDriverPrivate *this_00;
  QObject *in_RSI;
  QSqlDriver *in_RDI;
  
  this_00 = (QMYSQLDriverPrivate *)operator_new(0xd0);
  QMYSQLDriverPrivate::QMYSQLDriverPrivate(this_00);
  QSqlDriver::QSqlDriver(in_RDI,(QSqlDriverPrivate *)this_00,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_0012e158;
  init((QMYSQLDriver *)in_RDI,(EVP_PKEY_CTX *)this_00);
  qLibraryInit();
  return;
}

Assistant:

QMYSQLDriver::QMYSQLDriver(QObject * parent)
    : QSqlDriver(*new QMYSQLDriverPrivate, parent)
{
    init();
    qLibraryInit();
}